

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1537.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  size_t sVar2;
  void *__s1;
  char *pcVar3;
  char *pcVar4;
  char *raw;
  int outlen;
  int asize;
  char *ptr;
  CURLcode res;
  undefined8 uStack_26;
  uchar a [14];
  char *URL_local;
  
  uStack_26 = 0x913f3e3d3c3b3a2f;
  a[0] = 0xa2;
  a[1] = 0xb3;
  a[2] = 0xc4;
  a[3] = 0xd5;
  a[4] = 0xe6;
  a[5] = 0xf7;
  ptr._4_4_ = 0;
  _outlen = (char *)0x0;
  a._6_8_ = URL;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    raw._4_4_ = 0xe;
    _outlen = (char *)curl_easy_escape(0,&stack0xffffffffffffffda,0xe);
    curl_mprintf("%s\n",_outlen);
    curl_free(_outlen);
    _outlen = (char *)curl_escape(&stack0xffffffffffffffda,raw._4_4_);
    curl_mprintf("%s\n",_outlen);
    pcVar3 = _outlen;
    if (_outlen == (char *)0x0) {
      ptr._4_4_ = 0x7e;
    }
    else {
      sVar2 = strlen(_outlen);
      __s1 = (void *)curl_easy_unescape(0,pcVar3,sVar2 & 0xffffffff,&raw);
      curl_mprintf("outlen == %d\n",(int)raw);
      iVar1 = memcmp(__s1,&stack0xffffffffffffffda,(long)(int)raw);
      pcVar3 = "YES";
      if (iVar1 != 0) {
        pcVar3 = "no";
      }
      curl_mprintf("unescape == original? %s\n",pcVar3);
      curl_free(__s1);
      pcVar3 = _outlen;
      sVar2 = strlen(_outlen);
      pcVar3 = (char *)curl_unescape(pcVar3,sVar2 & 0xffffffff);
      if (pcVar3 == (char *)0x0) {
        ptr._4_4_ = 0x7e;
      }
      else {
        sVar2 = strlen(pcVar3);
        raw._0_4_ = (int)sVar2;
        curl_mprintf("[old] outlen == %d\n",sVar2 & 0xffffffff);
        iVar1 = memcmp(pcVar3,&stack0xffffffffffffffda,(long)(int)raw);
        pcVar4 = "YES";
        if (iVar1 != 0) {
          pcVar4 = "no";
        }
        curl_mprintf("[old] unescape == original? %s\n",pcVar4);
        curl_free(pcVar3);
        curl_free(_outlen);
        _outlen = (char *)curl_easy_escape(0,&stack0xffffffffffffffda,0xffffffff);
        curl_mprintf("escape -1 length: %s\n",_outlen);
        raw._0_4_ = 0x7e1;
        _outlen = (char *)curl_easy_unescape(0,"moahahaha",0xffffffff,&raw);
        curl_mprintf("unescape -1 length: %s %d\n",_outlen,(int)raw);
      }
    }
    curl_free(_outlen);
    curl_global_cleanup();
    URL_local._4_4_ = ptr._4_4_;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  const unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                             0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res = CURLE_OK;
  char *ptr = NULL;
  int asize;
  int outlen;
  char *raw;

  (void)URL; /* we don't use this */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);
  ptr = curl_easy_escape(NULL, (char *)a, asize);
  printf("%s\n", ptr);
  curl_free(ptr);

  /* deprecated API */
  ptr = curl_escape((char *)a, asize);
  printf("%s\n", ptr);
  if(!ptr) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  raw = curl_easy_unescape(NULL, ptr, (int)strlen(ptr), &outlen);
  printf("outlen == %d\n", outlen);
  printf("unescape == original? %s\n",
         memcmp(raw, a, outlen) ? "no" : "YES");
  curl_free(raw);

  /* deprecated API */
  raw = curl_unescape(ptr, (int)strlen(ptr));
  if(!raw) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  outlen = (int)strlen(raw);
  printf("[old] outlen == %d\n", outlen);
  printf("[old] unescape == original? %s\n",
         memcmp(raw, a, outlen) ? "no" : "YES");
  curl_free(raw);
  curl_free(ptr);

  /* weird input length */
  ptr = curl_easy_escape(NULL, (char *)a, -1);
  printf("escape -1 length: %s\n", ptr);

  /* weird input length */
  outlen = 2017; /* just a value */
  ptr = curl_easy_unescape(NULL, (char *)"moahahaha", -1, &outlen);
  printf("unescape -1 length: %s %d\n", ptr, outlen);

test_cleanup:
  curl_free(ptr);
  curl_global_cleanup();

  return (int)res;
}